

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inet.c
# Opt level: O3

LispPTR subr_TCP_ops(int op,LispPTR nameConn,LispPTR proto,LispPTR length,LispPTR bufaddr,
                    LispPTR maxlen)

{
  ushort uVar1;
  byte bVar2;
  undefined2 uVar3;
  undefined4 uVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  hostent *phVar8;
  size_t sVar9;
  ulong uVar10;
  int *piVar11;
  long lVar12;
  uint *puVar13;
  servent *psVar14;
  sockaddr *psVar15;
  sigset_t *psVar16;
  long lVar17;
  DLword *pDVar18;
  uint uVar19;
  uint uVar20;
  char *pcVar21;
  uint uVar22;
  uint ures;
  char servstring [50];
  char namestring [100];
  socklen_t local_fc;
  sockaddr local_f8 [4];
  sigset_t local_b8;
  
  uVar10 = (ulong)nameConn;
  uVar19 = op & 0xffff;
  uVar22 = 0;
  if (0x3f < uVar19) {
    if (uVar19 < 0x80) {
      if (uVar19 != 0x40) {
        if (uVar19 != 0x42) {
          return 0;
        }
        if ((nameConn & 0xfff0000) == 0xf0000) {
          uVar19 = nameConn | 0xffff0000;
        }
        else if ((nameConn & 0xfff0000) == 0xe0000) {
          uVar19 = nameConn & 0xffff;
        }
        else {
          if ((nameConn & 1) != 0) {
            printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar10);
          }
          uVar19 = *(uint *)(Lisp_world + uVar10);
        }
        pDVar18 = Lisp_world;
        local_fc = 0x10;
        local_b8.__val[0]._4_4_ =
             uVar19 >> 0x18 | (uVar19 & 0xff0000) >> 8 | (uVar19 & 0xff00) << 8 | uVar19 << 0x18;
        phVar8 = gethostbyaddr(&local_b8,0x10,0);
        if (phVar8 == (hostent *)0x0) {
          return 0xe0000;
        }
        strcpy((char *)(pDVar18 + proto),phVar8->h_name);
        sVar9 = strlen(phVar8->h_name);
        if ((long)sVar9 < 0) {
          if (0xfffffffffffeffff < sVar9) {
            return (uint)sVar9 & 0xfffff;
          }
        }
        else if (sVar9 < 0x10000) {
          return (uint)sVar9 | 0xe0000;
        }
        error("Not Smallp data");
        return 0xe0000;
      }
      if ((nameConn & 0xfff0000) == 0xf0000) {
        uVar19 = nameConn | 0xffff0000;
      }
      else if ((nameConn & 0xfff0000) == 0xe0000) {
        uVar19 = nameConn & 0xffff;
      }
      else {
        if ((nameConn & 1) != 0) {
          printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar10);
        }
        uVar19 = *(uint *)(Lisp_world + uVar10);
      }
      pDVar18 = Lisp_world + proto;
      local_fc = 0x10;
      getpeername(uVar19,(sockaddr *)&local_b8,&local_fc);
      phVar8 = gethostbyaddr((sockaddr *)&local_b8,local_fc,2);
      strcpy((char *)pDVar18,phVar8->h_name);
      sVar9 = strlen(phVar8->h_name);
      if ((long)sVar9 < 0) {
        if (0xfffffffffffeffff < sVar9) goto LAB_00126d17;
      }
      else if (sVar9 < 0x10000) goto LAB_0012757f;
    }
    else {
      if (uVar19 == 0x80) {
        if ((nameConn & 0xfff0000 | 0x10000) != 0xf0000) {
          if ((nameConn & 1) != 0) {
            printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar10);
          }
          uVar10 = (ulong)*(uint *)(Lisp_world + uVar10);
        }
        uVar19 = socket(2,2,0);
        local_f8[0].sa_data._0_2_ = (ushort)uVar10 << 8 | (ushort)uVar10 >> 8;
        local_f8[0].sa_family = 2;
        local_f8[0].sa_data._2_4_ = 0;
        iVar6 = bind(uVar19,local_f8,0x10);
        if (iVar6 < 0) {
          pcVar21 = "UDP bind";
          goto LAB_001275cd;
        }
        uVar22 = fcntl(uVar19,3,0);
        fcntl(uVar19,4,(ulong)(uVar22 | 0x2800));
        uVar22 = getpid();
        fcntl(uVar19,8,(ulong)uVar22);
        goto LAB_00126808;
      }
      if (uVar19 != 0x82) {
        if (uVar19 != 0x83) {
          return 0;
        }
        if ((nameConn & 0xfff0000) == 0xf0000) {
          uVar19 = nameConn | 0xffff0000;
        }
        else if ((nameConn & 0xfff0000) == 0xe0000) {
          uVar19 = nameConn & 0xffff;
        }
        else {
          if ((nameConn & 1) != 0) {
            printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar10);
          }
          uVar19 = *(uint *)(Lisp_world + uVar10);
        }
        pDVar18 = Lisp_world + proto;
        if ((length & 0xfff0000) == 0xf0000) {
          uVar22 = length | 0xffff0000;
        }
        else if ((length & 0xfff0000) == 0xe0000) {
          uVar22 = length & 0xffff;
        }
        else {
          if ((length & 1) != 0) {
            printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)length);
          }
          uVar22 = *(uint *)(Lisp_world + length);
        }
        local_fc = 0x10;
        uVar10 = recvfrom(uVar19,pDVar18,(long)(int)uVar22,0,local_f8,&local_fc);
        if ((int)uVar10 < 0) {
          pcVar21 = "UDP Recv";
          goto LAB_00127651;
        }
        uVar4 = local_f8[0].sa_data._2_4_;
        if ((bufaddr & 1) != 0) {
          printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)bufaddr);
        }
        *(undefined4 *)(Lisp_world + bufaddr) = uVar4;
        uVar3 = local_f8[0].sa_data._0_2_;
        if ((maxlen & 1) != 0) {
          printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)maxlen);
        }
        *(uint *)(Lisp_world + maxlen) = (uint)(ushort)uVar3;
        word_swap_page(pDVar18,(int)uVar10 + 3U >> 2);
        goto LAB_00127192;
      }
      if ((nameConn & 0xfff0000) == 0xf0000) {
        uVar19 = nameConn | 0xffff0000;
      }
      else if ((nameConn & 0xfff0000) == 0xe0000) {
        uVar19 = nameConn & 0xffff;
      }
      else {
        if ((nameConn & 1) != 0) {
          printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar10);
        }
        uVar19 = *(uint *)(Lisp_world + uVar10);
      }
      local_f8[0].sa_family = 2;
      if ((length & 0xfff0000 | 0x10000) != 0xf0000) {
        if ((length & 1) != 0) {
          printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)length);
        }
        length = *(LispPTR *)(Lisp_world + length);
      }
      local_f8[0].sa_data._0_2_ = (ushort)length << 8 | (ushort)length >> 8;
      if ((proto & 0xfff0000) == 0xf0000) {
        uVar22 = proto | 0xffff0000;
      }
      else if ((proto & 0xfff0000) == 0xe0000) {
        uVar22 = proto & 0xffff;
      }
      else {
        if ((proto & 1) != 0) {
          printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)proto);
        }
        uVar22 = *(uint *)(Lisp_world + proto);
      }
      local_f8[0].sa_data._2_4_ =
           uVar22 >> 0x18 | (uVar22 & 0xff0000) >> 8 | (uVar22 & 0xff00) << 8 | uVar22 << 0x18;
      pDVar18 = Lisp_world + bufaddr;
      if ((maxlen & 0xfff0000) == 0xf0000) {
        uVar22 = maxlen | 0xffff0000;
      }
      else if ((maxlen & 0xfff0000) == 0xe0000) {
        uVar22 = maxlen & 0xffff;
      }
      else {
        if ((maxlen & 1) != 0) {
          printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)maxlen);
        }
        uVar22 = *(uint *)(Lisp_world + maxlen);
      }
      uVar20 = (int)(uVar22 + 3) >> 2;
      word_swap_page(pDVar18,uVar20);
      uVar10 = sendto(uVar19,pDVar18,(long)(int)uVar22,0,local_f8,0x10);
      word_swap_page(pDVar18,uVar20);
      if ((int)(uint)uVar10 < 0) {
        perror("UDP Send");
        printf(" fd = %d, addr = 0x%x.\n",(ulong)uVar19,(ulong)local_f8[0]._0_8_ >> 0x20);
        return 0;
      }
      if ((uVar10 & 0x7fff0000) == 0) {
        return (uint)uVar10 | 0xe0000;
      }
    }
    goto LAB_00127301;
  }
  switch(uVar19) {
  case 0:
    if ((nameConn & 1) != 0) {
      printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar10);
    }
    iVar6 = *(int *)(Lisp_world + uVar10 + 4);
    iVar5 = 100;
    if (iVar6 < 100) {
      iVar5 = iVar6;
    }
    lVar12 = (long)iVar5;
    if ((char)Lisp_world[uVar10 + 3] == 'D') {
      if (iVar6 == 0) {
        psVar16 = &local_b8;
      }
      else {
        lVar12 = lVar12 + (ulong)(lVar12 == 0);
        pDVar18 = Lisp_world +
                  (ulong)Lisp_world[uVar10 + 2] +
                  (ulong)(*(uint *)(Lisp_world + uVar10) & 0xfffffff);
        psVar16 = &local_b8;
        do {
          *(undefined1 *)psVar16->__val = *(undefined1 *)((ulong)pDVar18 ^ 2);
          psVar16 = (sigset_t *)((long)psVar16->__val + 1);
          pDVar18 = pDVar18 + 1;
          lVar12 = lVar12 + -1;
        } while (lVar12 != 0);
      }
      *(undefined1 *)psVar16->__val = 0;
    }
    else if ((char)Lisp_world[uVar10 + 3] == 'C') {
      if (iVar6 != 0) {
        uVar19 = *(uint *)(Lisp_world + uVar10);
        uVar1 = Lisp_world[uVar10 + 2];
        lVar17 = 0;
        do {
          *(undefined1 *)((long)local_b8.__val + lVar17) =
               *(undefined1 *)
                ((long)Lisp_world + lVar17 + (ulong)uVar1 + (ulong)(uVar19 & 0xfffffff) * 2 ^ 3);
          lVar17 = lVar17 + 1;
        } while (lVar12 + (ulong)(lVar12 == 0) != lVar17);
      }
      *(undefined1 *)((long)local_b8.__val + lVar12) = 0;
    }
    else {
      error("LispStringToCString: Not a character array.\n");
    }
    phVar8 = gethostbyname((char *)&local_b8);
    if (phVar8 == (hostent *)0x0) {
      return 0;
    }
    uVar19 = *(uint *)*phVar8->h_addr_list;
    uVar20 = uVar19 >> 0x18 | (uVar19 & 0xff0000) >> 8;
    uVar7 = (uVar19 & 0xff00) << 8;
    uVar22 = uVar20 | uVar7 | uVar19 << 0x18;
    uVar7 = uVar7 | uVar19 << 0x18;
    if (uVar7 == 0xffff0000) {
      return uVar20 | 0xf0000;
    }
    if (uVar7 != 0) {
      puVar13 = (uint *)createcell68k(2);
      *puVar13 = uVar22;
      if (((ulong)puVar13 & 1) != 0) {
        printf("Misaligned pointer in LAddrFromNative %p\n",puVar13);
      }
      return (LispPTR)((ulong)((long)puVar13 - (long)Lisp_world) >> 1);
    }
    goto LAB_00127425;
  case 1:
    if ((nameConn & 1) != 0) {
      printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar10);
    }
    iVar6 = *(int *)(Lisp_world + uVar10 + 4);
    iVar5 = 100;
    if (iVar6 < 100) {
      iVar5 = iVar6;
    }
    lVar12 = (long)iVar5;
    if ((char)Lisp_world[uVar10 + 3] == 'D') {
      if (iVar6 == 0) {
        psVar16 = &local_b8;
      }
      else {
        lVar12 = lVar12 + (ulong)(lVar12 == 0);
        pDVar18 = Lisp_world +
                  (ulong)Lisp_world[uVar10 + 2] +
                  (ulong)(*(uint *)(Lisp_world + uVar10) & 0xfffffff);
        psVar16 = &local_b8;
        do {
          *(undefined1 *)psVar16->__val = *(undefined1 *)((ulong)pDVar18 ^ 2);
          psVar16 = (sigset_t *)((long)psVar16->__val + 1);
          pDVar18 = pDVar18 + 1;
          lVar12 = lVar12 + -1;
        } while (lVar12 != 0);
      }
      *(undefined1 *)psVar16->__val = 0;
    }
    else if ((char)Lisp_world[uVar10 + 3] == 'C') {
      if (iVar6 != 0) {
        uVar19 = *(uint *)(Lisp_world + uVar10);
        uVar1 = Lisp_world[uVar10 + 2];
        lVar17 = 0;
        do {
          *(undefined1 *)((long)local_b8.__val + lVar17) =
               *(undefined1 *)
                ((long)Lisp_world + lVar17 + (ulong)uVar1 + (ulong)(uVar19 & 0xfffffff) * 2 ^ 3);
          lVar17 = lVar17 + 1;
        } while (lVar12 + (ulong)(lVar12 == 0) != lVar17);
      }
      *(undefined1 *)((long)local_b8.__val + lVar12) = 0;
    }
    else {
      error("LispStringToCString: Not a character array.\n");
    }
    if ((proto & 1) != 0) {
      printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)proto);
    }
    iVar6 = *(int *)(Lisp_world + (ulong)proto + 4);
    iVar5 = 0x32;
    if (iVar6 < 0x32) {
      iVar5 = iVar6;
    }
    lVar12 = (long)iVar5;
    if ((char)Lisp_world[(ulong)proto + 3] == 'D') {
      if (iVar6 == 0) {
        psVar15 = local_f8;
      }
      else {
        lVar12 = lVar12 + (ulong)(lVar12 == 0);
        pDVar18 = Lisp_world +
                  (ulong)Lisp_world[(ulong)proto + 2] +
                  (ulong)(*(uint *)(Lisp_world + proto) & 0xfffffff);
        psVar15 = local_f8;
        do {
          *(undefined1 *)&psVar15->sa_family = *(undefined1 *)((ulong)pDVar18 ^ 2);
          psVar15 = (sockaddr *)((long)&psVar15->sa_family + 1);
          pDVar18 = pDVar18 + 1;
          lVar12 = lVar12 + -1;
        } while (lVar12 != 0);
      }
      *(undefined1 *)&psVar15->sa_family = 0;
    }
    else if ((char)Lisp_world[(ulong)proto + 3] == 'C') {
      if (iVar6 != 0) {
        uVar19 = *(uint *)(Lisp_world + proto);
        uVar1 = Lisp_world[(ulong)proto + 2];
        lVar17 = 0;
        do {
          local_f8[0].sa_data[lVar17 + -2] =
               *(char *)((long)Lisp_world + lVar17 + (ulong)uVar1 + (ulong)(uVar19 & 0xfffffff) * 2
                        ^ 3);
          lVar17 = lVar17 + 1;
        } while (lVar12 + (ulong)(lVar12 == 0) != lVar17);
      }
      local_f8[0].sa_data[lVar12 + -2] = '\0';
    }
    else {
      error("LispStringToCString: Not a character array.\n");
    }
    psVar14 = getservbyname((char *)&local_b8,(char *)local_f8);
    if (psVar14 == (servent *)0x0) {
      return 0;
    }
    uVar1 = (ushort)psVar14->s_port;
    sVar9 = (size_t)(ushort)(uVar1 << 8 | uVar1 >> 8);
LAB_0012757f:
    return (uint)sVar9 | 0xe0000;
  case 2:
    if ((nameConn & 0xfff0000) == 0xf0000) {
      uVar19 = nameConn | 0xffff0000;
    }
    else if ((nameConn & 0xfff0000) == 0xe0000) {
      uVar19 = nameConn & 0xffff;
    }
    else {
      if ((nameConn & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar10);
      }
      uVar19 = *(uint *)(Lisp_world + uVar10);
    }
    if ((proto & 0xfff0000) == 0xf0000) {
      uVar22 = proto | 0xffff0000;
    }
    else if ((proto & 0xfff0000) == 0xe0000) {
      uVar22 = proto & 0xffff;
    }
    else {
      if ((proto & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)proto);
      }
      uVar22 = *(uint *)(Lisp_world + proto);
    }
    uVar19 = socket(uVar19,uVar22,0);
    sVar9 = (size_t)uVar19;
    uVar22 = fcntl(uVar19,3,0);
    fcntl(uVar19,4,(ulong)(uVar22 | 0x2800));
    uVar22 = getpid();
    fcntl(uVar19,8,(ulong)uVar22);
    if ((int)uVar19 < 0) {
      if (0xfffeffff < uVar19) {
LAB_00126d17:
        return (uint)sVar9 & 0xfffff;
      }
    }
    else if (uVar19 < 0x10000) goto LAB_0012757f;
    break;
  case 3:
    if ((nameConn & 0xfff0000) == 0xf0000) {
      uVar19 = nameConn | 0xffff0000;
    }
    else if ((nameConn & 0xfff0000) == 0xe0000) {
      uVar19 = nameConn & 0xffff;
    }
    else {
      if ((nameConn & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar10);
      }
      uVar19 = *(uint *)(Lisp_world + uVar10);
    }
    bVar2 = (byte)uVar19 & 0x3f;
    uVar10 = -2L << bVar2 | 0xfffffffffffffffeU >> 0x40 - bVar2;
    uVar22 = uVar19 + 0x3f;
    if (-1 < (int)uVar19) {
      uVar22 = uVar19;
    }
    LispIOFds.__fds_bits[(int)uVar22 >> 6] = LispIOFds.__fds_bits[(int)uVar22 >> 6] & uVar10;
    LispReadFds.__fds_bits[(int)uVar22 >> 6] = LispReadFds.__fds_bits[(int)uVar22 >> 6] & uVar10;
    shutdown(uVar19,2);
    close(uVar19);
    return 0x4c;
  case 4:
    local_f8[0].sa_family = 0;
    local_f8[0].sa_data[0] = '\0';
    local_f8[0].sa_data[1] = '\0';
    local_f8[0].sa_data[2] = '\0';
    local_f8[0].sa_data[3] = '\0';
    local_f8[0].sa_data[4] = '\0';
    local_f8[0].sa_data[5] = '\0';
    local_f8[0].sa_data[6] = '\0';
    local_f8[0].sa_data[7] = '\0';
    local_f8[0].sa_data[8] = '\0';
    local_f8[0].sa_data[9] = '\0';
    local_f8[0].sa_data[10] = '\0';
    local_f8[0].sa_data[0xb] = '\0';
    local_f8[0].sa_data[0xc] = '\0';
    local_f8[0].sa_data[0xd] = '\0';
    if ((nameConn & 0xfff0000) == 0xf0000) {
      uVar19 = nameConn | 0xffff0000;
LAB_00126a9b:
      local_f8[0].sa_data._2_4_ =
           uVar19 >> 0x18 | (uVar19 & 0xff0000) >> 8 | (uVar19 & 0xff00) << 8 | uVar19 << 0x18;
    }
    else {
      if ((nameConn & 0xfff0000) == 0xe0000) {
        uVar19 = nameConn & 0xffff;
        goto LAB_00126a9b;
      }
      if ((*(ushort *)((ulong)(nameConn >> 8 & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff) == 2) {
        if ((nameConn & 1) != 0) {
          printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar10);
        }
        uVar19 = *(uint *)(Lisp_world + uVar10);
        goto LAB_00126a9b;
      }
      if ((nameConn & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar10);
      }
      iVar6 = *(int *)(Lisp_world + uVar10 + 4);
      iVar5 = 100;
      if (iVar6 < 100) {
        iVar5 = iVar6;
      }
      lVar12 = (long)iVar5;
      if ((char)Lisp_world[uVar10 + 3] == 'D') {
        if (iVar6 == 0) {
          psVar16 = &local_b8;
        }
        else {
          lVar12 = lVar12 + (ulong)(lVar12 == 0);
          pDVar18 = Lisp_world +
                    (ulong)Lisp_world[uVar10 + 2] +
                    (ulong)(*(uint *)(Lisp_world + uVar10) & 0xfffffff);
          psVar16 = &local_b8;
          do {
            *(undefined1 *)psVar16->__val = *(undefined1 *)((ulong)pDVar18 ^ 2);
            psVar16 = (sigset_t *)((long)psVar16->__val + 1);
            pDVar18 = pDVar18 + 1;
            lVar12 = lVar12 + -1;
          } while (lVar12 != 0);
        }
        *(undefined1 *)psVar16->__val = 0;
      }
      else if ((char)Lisp_world[uVar10 + 3] == 'C') {
        if (iVar6 != 0) {
          uVar19 = *(uint *)(Lisp_world + uVar10);
          uVar1 = Lisp_world[uVar10 + 2];
          lVar17 = 0;
          do {
            *(undefined1 *)((long)local_b8.__val + lVar17) =
                 *(undefined1 *)
                  ((long)Lisp_world + lVar17 + (ulong)uVar1 + (ulong)(uVar19 & 0xfffffff) * 2 ^ 3);
            lVar17 = lVar17 + 1;
          } while (lVar12 + (ulong)(lVar12 == 0) != lVar17);
        }
        *(undefined1 *)((long)local_b8.__val + lVar12) = 0;
      }
      else {
        error("LispStringToCString: Not a character array.\n");
      }
      phVar8 = gethostbyname((char *)&local_b8);
      if (phVar8 == (hostent *)0x0) {
        return 0;
      }
      memcpy(local_f8[0].sa_data + 2,*phVar8->h_addr_list,(long)phVar8->h_length);
    }
    if ((proto & 0xfff0000 | 0x10000) != 0xf0000) {
      if ((proto & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)proto);
      }
      proto = *(LispPTR *)(Lisp_world + proto);
    }
    uVar22 = socket(2,1,0);
    local_f8[0].sa_data._0_2_ = (ushort)proto << 8 | (ushort)proto >> 8;
    local_f8[0].sa_family = 2;
    iVar6 = connect(uVar22,local_f8,0x10);
    if (iVar6 < 0) {
      pcVar21 = "TCP connect";
LAB_00127651:
      perror(pcVar21);
      return 0;
    }
    uVar19 = fcntl(uVar22,3,0);
    fcntl(uVar22,4,(ulong)(uVar19 | 0x800));
    uVar19 = getpid();
    fcntl(uVar22,8,(ulong)uVar19);
    if (-1 < (int)uVar22) goto LAB_001272f5;
    if (0xfffeffff < uVar22) {
      return uVar22 & 0xfffff;
    }
    break;
  case 5:
    if ((nameConn & 0xfff0000) == 0xf0000) {
      uVar19 = nameConn | 0xffff0000;
    }
    else if ((nameConn & 0xfff0000) == 0xe0000) {
      uVar19 = nameConn & 0xffff;
    }
    else {
      if ((nameConn & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar10);
      }
      uVar19 = *(uint *)(Lisp_world + uVar10);
    }
    pDVar18 = Lisp_world + proto;
    if ((length & 0xfff0000) == 0xf0000) {
      uVar22 = length | 0xffff0000;
    }
    else if ((length & 0xfff0000) == 0xe0000) {
      uVar22 = length & 0xffff;
    }
    else {
      if ((length & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)length);
      }
      uVar22 = *(uint *)(Lisp_world + length);
    }
    uVar20 = (int)(uVar22 + 3) >> 2;
    word_swap_page(pDVar18,uVar20);
    uVar10 = send(uVar19,pDVar18,(long)(int)uVar22,0);
    word_swap_page(pDVar18,uVar20);
    if ((int)uVar10 < 0) {
      pcVar21 = "TCP send";
      goto LAB_00127651;
    }
LAB_00127192:
    if ((uVar10 & 0x7fff0000) == 0) {
      return (uint)uVar10 | 0xe0000;
    }
    break;
  case 6:
    if ((nameConn & 0xfff0000) == 0xf0000) {
      uVar19 = nameConn | 0xffff0000;
    }
    else if ((nameConn & 0xfff0000) == 0xe0000) {
      uVar19 = nameConn & 0xffff;
    }
    else {
      if ((nameConn & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar10);
      }
      uVar19 = *(uint *)(Lisp_world + uVar10);
    }
    pDVar18 = Lisp_world + proto;
    if ((length & 0xfff0000) == 0xf0000) {
      uVar22 = length | 0xffff0000;
    }
    else if ((length & 0xfff0000) == 0xe0000) {
      uVar22 = length & 0xffff;
    }
    else {
      if ((length & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)length);
      }
      uVar22 = *(uint *)(Lisp_world + length);
    }
    sVar9 = read(uVar19,pDVar18,(long)(int)uVar22);
    if ((int)sVar9 < 0) {
      piVar11 = __errno_location();
      if (*piVar11 == 0xb) {
        return 0x4c;
      }
      subr_TCP_ops_cold_2();
      return 0;
    }
    word_swap_page(pDVar18,(int)sVar9 + 3U >> 2);
    if ((sVar9 & 0x7fff0000) == 0) goto LAB_0012757f;
    break;
  case 7:
    if ((nameConn & 0xfff0000 | 0x10000) != 0xf0000) {
      if ((nameConn & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar10);
      }
      uVar10 = (ulong)*(uint *)(Lisp_world + uVar10);
    }
    uVar19 = socket(2,1,0);
    local_f8[0].sa_data._0_2_ = (ushort)uVar10 << 8 | (ushort)uVar10 >> 8;
    local_f8[0].sa_family = 2;
    local_f8[0].sa_data._2_4_ = 0;
    iVar6 = bind(uVar19,local_f8,0x10);
    if (iVar6 < 0) {
      pcVar21 = "TCP bind";
LAB_001275cd:
      perror(pcVar21);
      close(uVar19);
      return 0;
    }
    sigemptyset(&local_b8);
    sigaddset(&local_b8,0x1d);
    sigprocmask(0,&local_b8,(sigset_t *)0x0);
    uVar22 = fcntl(uVar19,3,0);
    fcntl(uVar19,4,(ulong)(uVar22 | 0x2800));
    uVar22 = getpid();
    fcntl(uVar19,8,(ulong)uVar22);
    iVar6 = listen(uVar19,5);
    if (iVar6 == -1) {
      subr_TCP_ops_cold_1();
      return 0;
    }
    sigprocmask(1,&local_b8,(sigset_t *)0x0);
LAB_00126808:
    uVar22 = uVar19 + 0x3f;
    if (-1 < (int)uVar19) {
      uVar22 = uVar19;
    }
    uVar10 = 1L << ((byte)uVar19 & 0x3f);
    LispIOFds.__fds_bits[(int)uVar22 >> 6] = LispIOFds.__fds_bits[(int)uVar22 >> 6] | uVar10;
    LispReadFds.__fds_bits[(int)uVar22 >> 6] = LispReadFds.__fds_bits[(int)uVar22 >> 6] | uVar10;
    if ((int)uVar19 < 0) {
      if (0xfffeffff < uVar19) {
        return uVar19 & 0xfffff;
      }
    }
    else if (uVar19 < 0x10000) {
      return uVar19 | 0xe0000;
    }
    break;
  case 8:
    if ((nameConn & 0xfff0000) == 0xf0000) {
      uVar19 = nameConn | 0xffff0000;
    }
    else if ((nameConn & 0xfff0000) == 0xe0000) {
      uVar19 = nameConn & 0xffff;
    }
    else {
      if ((nameConn & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n");
      }
      uVar19 = *(uint *)(Lisp_world + uVar10);
    }
    uVar22 = accept(uVar19,(sockaddr *)0x0,(socklen_t *)0x0);
    if ((int)uVar22 < 0) {
      piVar11 = __errno_location();
      if (*piVar11 == 0xb) {
        return 0;
      }
      pcVar21 = "TCP Accept";
      goto LAB_00127651;
    }
    uVar19 = fcntl(uVar22,3,0);
    fcntl(uVar22,4,(ulong)(uVar19 | 0x800));
    uVar19 = getpid();
    fcntl(uVar22,8,(ulong)uVar19);
LAB_001272f5:
    if (0xffff < uVar22) break;
LAB_00127425:
    uVar22 = uVar22 | 0xe0000;
  default:
    goto switchD_00126460_default;
  }
LAB_00127301:
  error("Not Smallp data");
  uVar22 = 0xe0000;
switchD_00126460_default:
  return uVar22;
}

Assistant:

LispPTR subr_TCP_ops(int op, LispPTR nameConn, LispPTR proto, LispPTR length, LispPTR bufaddr, LispPTR maxlen)
{
#ifndef DOS
  int sock, len, buflen, res;
  unsigned ures;
  char namestring[100];
  char servstring[50];
  struct sockaddr_in addr;
  struct hostent *host;
  struct servent *service;
  struct sockaddr_in farend;
  int addr_class, protocol;
  DLword *buffer;
  int result;

  switch (op & 0xFFFF) {
    case TCPhostlookup:
      LispStringToCString(nameConn, namestring, 100);
      host = gethostbyname(namestring);
      if (!host) return (NIL);
      res = ntohl(*(in_addr_t *)host->h_addr);
      N_ARITH_SWITCH(res);
      break;

    case TCPservicelookup:
      LispStringToCString(nameConn, namestring, 100);
      LispStringToCString(proto, servstring, 50);
      service = getservbyname(namestring, servstring);
      if (!service) return (NIL);
      return (GetSmallp(ntohs(service->s_port)));

    case TCPsocket:
      addr_class = LispNumToCInt(nameConn);
      protocol = LispNumToCInt(proto);
      result = socket(addr_class, protocol, 0);
#ifndef MAIKO_OS_HAIKU
      fcntl(result, F_SETFL, fcntl(result, F_GETFL, 0) | O_ASYNC | O_NONBLOCK);
#else
      fcntl(result, F_SETFL, fcntl(result, F_GETFL, 0) | O_NONBLOCK);
#endif
#ifdef F_SETOWN
      fcntl(result, F_SETOWN, getpid());
#endif

      return (GetSmallp(result));
    case TCPconnect: /* args: hostname or (fixp)address, socket# */
      memset(&farend, 0, sizeof farend);
      N_GETNUMBER(nameConn, res, string_host);
      farend.sin_addr.s_addr = htonl(res);
      goto host_ok;
    string_host:
      LispStringToCString(nameConn, namestring, 100);
      host = gethostbyname(namestring);
      if (!host) return (NIL);
      memcpy((char *)&farend.sin_addr, (char *)host->h_addr, host->h_length);
    host_ok:
      sock = LispNumToCInt(proto);
      result = socket(AF_INET, SOCK_STREAM, 0);
      farend.sin_family = AF_INET;
      farend.sin_port = htons(sock);
      if (connect(result, (struct sockaddr *)&farend, sizeof farend) < 0) {
        perror("TCP connect");
        return (NIL);
      }
      fcntl(result, F_SETFL, fcntl(result, F_GETFL, 0) | O_NONBLOCK);
#ifdef F_SETOWN
      fcntl(result, F_SETOWN, getpid());
#endif

      return (GetSmallp(result));

    case TCPsend: /* args: conn, buffer, len */
      sock = LispNumToCInt(nameConn);
      buffer = NativeAligned2FromLAddr(proto);
      len = LispNumToCInt(length);
      DBPRINT(("sock: %d, len %d.\n", sock, len));

#ifdef BYTESWAP
      word_swap_page(buffer, (len + 3) >> 2);
#endif /* BYTESWAP */

      result = send(sock, buffer, len, 0);

#ifdef BYTESWAP
      word_swap_page(buffer, (len + 3) >> 2);
#endif /* BYTESWAP */

      if (result < 0) {
        perror("TCP send");
        return (NIL);
      }
      return (GetSmallp(result));

    case TCPrecv: /* args: conn, buffer, maxlen */
      sock = LispNumToCInt(nameConn);
      buffer = NativeAligned2FromLAddr(proto);
      len = LispNumToCInt(length);
      result = read(sock, buffer, len);
      if (result < 0) {
        if (errno == EWOULDBLOCK) return (ATOM_T);
        perror("TCP read");
        *Lisp_errno = errno;
        return (NIL);
      }
#ifdef BYTESWAP
      word_swap_page(buffer, (result + 3) >> 2);
#endif /* BYTESWAP */

      return (GetSmallp(result));

    case TCPclose:
      sock = LispNumToCInt(nameConn);
      FD_CLR(sock, &LispIOFds);
      FD_CLR(sock, &LispReadFds);
      shutdown(sock, 2);
      close(sock);
      return (ATOM_T);

    case TCPListen: /* socket# to listen on */
      sock = LispNumToCInt(nameConn);
      result = socket(AF_INET, SOCK_STREAM, 0);
      farend.sin_family = AF_INET;
      farend.sin_port = htons(sock);
      farend.sin_addr.s_addr = INADDR_ANY;
      if (bind(result, (struct sockaddr *)&farend, sizeof(farend)) < 0) {
        perror("TCP bind");
        close(result);
        return (NIL);
      }
      { /* Do this without taking IO interrupts */
        sigset_t signals;

        sigemptyset(&signals);
#ifndef MAIKO_OS_HAIKU
        sigaddset(&signals, SIGIO);
#endif
        sigprocmask(SIG_BLOCK, &signals, NULL);

#ifndef MAIKO_OS_HAIKU
        fcntl(result, F_SETFL, fcntl(result, F_GETFL, 0) | O_ASYNC | O_NONBLOCK);
#else
        fcntl(result, F_SETFL, fcntl(result, F_GETFL, 0) | O_NONBLOCK);
#endif

#ifdef F_SETOWN
	fcntl(result, F_SETOWN, getpid());
#endif
        if (listen(result, 5) == -1) {
          perror("TCP Listen");
          close(result);
          sigprocmask(SIG_UNBLOCK, &signals, NULL);
          return (NIL);
        }
        sigprocmask(SIG_UNBLOCK, &signals, NULL);
      }
      FD_SET(result, &LispIOFds);  /* so we get interrupts */
      FD_SET(result, &LispReadFds);
      DBPRINT(("LispIOFds = %p\n", (void *)&LispIOFds));
      return (GetSmallp(result));

    case TCPAccept: /* Socket we're listening on */
      sock = LispNumToCInt(nameConn);
      result = accept(sock, NULL, 0);
      if (result < 0) {
        if (errno != EWOULDBLOCK) perror("TCP Accept");
        return (NIL);
      }
      fcntl(result, F_SETFL, fcntl(result, F_GETFL, 0) | O_NONBLOCK);
#ifdef F_SETOWN
      fcntl(result, F_SETOWN, getpid());
#endif
      return (GetSmallp(result));

    case INETpeername: /* socket#, buffer for name string */
      sock = LispNumToCInt(nameConn);
      buffer = NativeAligned2FromLAddr(proto);
      ures = sizeof(addr);
      getpeername(sock, (struct sockaddr *)&addr, &ures);
      host = gethostbyaddr((const char *)&addr, ures, AF_INET);
      strcpy((char *)buffer, host->h_name);
      return (GetSmallp(strlen(host->h_name)));

    case INETgetname: /* host addr, buffer for name string */
      sock = LispNumToCInt(nameConn);
      buffer = NativeAligned2FromLAddr(proto);
      ures = sizeof(addr);
      addr.sin_addr.s_addr = htonl(sock);
      host = gethostbyaddr((const char *)&addr, ures, 0);
      if (!host) return (GetSmallp(0));
      strcpy((char *)buffer, host->h_name);
      return (GetSmallp(strlen(host->h_name)));

    case UDPListen: /* socket# to listen on */
      sock = LispNumToCInt(nameConn);
      result = socket(AF_INET, SOCK_DGRAM, 0);
      farend.sin_family = AF_INET;
      farend.sin_port = htons(sock);
      farend.sin_addr.s_addr = INADDR_ANY;
      if (bind(result, (struct sockaddr *)&farend, sizeof(farend)) < 0) {
        perror("UDP bind");
        close(result);
        return (NIL);
      }
#ifndef MAIKO_OS_HAIKU
      fcntl(result, F_SETFL, fcntl(result, F_GETFL, 0) | O_ASYNC | O_NONBLOCK);
#else
      fcntl(result, F_SETFL, fcntl(result, F_GETFL, 0) | O_NONBLOCK);
#endif
#ifdef F_SETOWN
      fcntl(result, F_SETOWN, getpid());
#endif
      FD_SET(result, &LispIOFds);  /* so we get interrupts */
      FD_SET(result, &LispReadFds);
      DBPRINT(("LispIOFds = %p\n", (void *)&LispIOFds));
      return (GetSmallp(result));

    case UDPSendto: /* fd-socket# addr remote-socket buffer len*/
      sock = LispNumToCInt(nameConn);
      farend.sin_family = AF_INET;
      farend.sin_port = htons(LispNumToCInt(length));
      farend.sin_addr.s_addr = htonl(LispNumToCInt(proto));
      buffer = NativeAligned2FromLAddr(bufaddr);
      buflen = LispNumToCInt(maxlen);

      DBPRINT(("UDP send:  socket = %d, remote-port = %d.\n", sock, farend.sin_port));
      DBPRINT(("           remote-addr = 0x%x, buflen = %d.\n", farend.sin_addr.s_addr, buflen));

#ifdef BYTESWAP
      word_swap_page(buffer, (buflen + 3) >> 2);
#endif /* BYTESWAP */
      result = sendto(sock, buffer, buflen, 0, (struct sockaddr *)&farend, sizeof farend);
#ifdef BYTESWAP
        word_swap_page(buffer, (buflen + 3) >> 2);
#endif /* BYTESWAP */
      if (result < 0) {
        perror("UDP Send");
        printf(" fd = %d, addr = 0x%x.\n", sock, farend.sin_addr.s_addr);
        return (NIL);
      }
      return (GetSmallp(result));

    case UDPRecvfrom: /* fd-socket# buffer len addr-cell port-cell*/
      sock = LispNumToCInt(nameConn);
      buffer = NativeAligned2FromLAddr(proto);
      buflen = LispNumToCInt(length);
      ures = sizeof farend;
      if ((result = recvfrom(sock, buffer, buflen, 0, (struct sockaddr *)&farend, &ures)) < 0) {
        perror("UDP Recv");
        return (NIL);
      }

      DBPRINT(("UDP recv:  socket = %d, len = %d.\n", sock, result));
      DBPRINT(("           remote-addr = 0x%x, remote-port = %d.\n", ntohl(farend.sin_addr.s_addr),
               ntohs(farend.sin_port)));
      DBPRINT(("           bufsize = %d, addrcell = 0x%x, portcell = 0x%x.\n", buflen, bufaddr,
               maxlen));

      /* XXX NBriggs: 12 Aug 2020 -- WHAT IS GOING ON HERE? */
      *((int *)NativeAligned4FromLAddr(bufaddr)) = (int)farend.sin_addr.s_addr;
      *((int *)NativeAligned4FromLAddr(maxlen)) = (int)farend.sin_port;

#ifdef BYTESWAP
      word_swap_page(buffer, (result + 3) >> 2);
#endif /* BYTESWAP */

      return (GetSmallp(result));

    default: return (NIL);
  }
#endif /* DOS */
}